

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::GetSseSum16x16DualTest_DISABLED_Speed_Test::TestBody
          (GetSseSum16x16DualTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  __time_t _Var4;
  __suseconds_t _Var5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  GetSseSum16x16DualTest_DISABLED_Speed_Test *pGVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  GetSseSum16x16DualTest_DISABLED_Speed_Test *local_98;
  uint var2 [2];
  uint var1 [2];
  aom_usec_timer timer;
  uint sse2 [2];
  uint sse1 [2];
  
  iVar1 = (this->super_GetSseSum16x16DualTest).params_.block_size;
  iVar6 = (int)(1000000000 / (long)iVar1);
  if (0 < iVar1) {
    this_00 = &(this->super_GetSseSum16x16DualTest).rnd_;
    lVar11 = 0;
    do {
      uVar7 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum16x16DualTest).src_[lVar11] = (uint8_t)(uVar7 >> 0x17);
      uVar7 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum16x16DualTest).ref_[lVar11] = (uint8_t)(uVar7 >> 0x17);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->super_GetSseSum16x16DualTest).params_.block_size);
  }
  sse1[0] = 0;
  sse1[1] = 0;
  sse2[0] = 0;
  sse2[1] = 0;
  var1[0] = 0;
  var1[1] = 0;
  var2[0] = 0;
  var2[1] = 0;
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  iVar1 = (this->super_GetSseSum16x16DualTest).params_.width;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  pGVar12 = this;
  if (0 < iVar6) {
    iVar10 = (this->super_GetSseSum16x16DualTest).params_.height;
    iVar9 = 0;
    local_98 = this;
    do {
      if (0 < iVar10) {
        iVar8 = (pGVar12->super_GetSseSum16x16DualTest).params_.width;
        lVar14 = 0;
        lVar11 = 0;
        do {
          if (0 < iVar8) {
            iVar10 = 0;
            lVar13 = lVar14;
            do {
              aom_get_var_sse_sum_16x16_dual_c
                        ((this->super_GetSseSum16x16DualTest).src_ + lVar13,iVar1,
                         (this->super_GetSseSum16x16DualTest).ref_ + lVar13,iVar1,sse2,&sse_tot_c,
                         &sum_tot_c,var2);
              iVar8 = (this->super_GetSseSum16x16DualTest).params_.width;
              iVar10 = iVar10 + 0x20;
              lVar13 = lVar13 + 0x20;
            } while (iVar10 < iVar8);
            iVar10 = (local_98->super_GetSseSum16x16DualTest).params_.height;
            pGVar12 = local_98;
          }
          lVar11 = lVar11 + 0x10;
          lVar14 = lVar14 + (long)iVar1 * 0x10;
        } while (lVar11 < iVar10);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar6);
  }
  iVar10 = 0;
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  _Var5 = timer.end.tv_usec;
  _Var4 = timer.end.tv_sec;
  _Var3 = timer.begin.tv_usec;
  _Var2 = timer.begin.tv_sec;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  if (0 < iVar6) {
    iVar9 = (pGVar12->super_GetSseSum16x16DualTest).params_.height;
    do {
      if (0 < iVar9) {
        iVar8 = (pGVar12->super_GetSseSum16x16DualTest).params_.width;
        lVar11 = 0;
        lVar14 = 0;
        do {
          if (0 < iVar8) {
            iVar9 = 0;
            lVar13 = lVar11;
            do {
              (*(pGVar12->super_GetSseSum16x16DualTest).params_.func)
                        ((pGVar12->super_GetSseSum16x16DualTest).src_ + lVar13,iVar1,
                         (pGVar12->super_GetSseSum16x16DualTest).ref_ + lVar13,iVar1,sse1,
                         &sse_tot_simd,&sum_tot_simd,var1);
              iVar8 = (pGVar12->super_GetSseSum16x16DualTest).params_.width;
              iVar9 = iVar9 + 0x20;
              lVar13 = lVar13 + 0x20;
            } while (iVar9 < iVar8);
            iVar9 = (pGVar12->super_GetSseSum16x16DualTest).params_.height;
          }
          lVar14 = lVar14 + 0x10;
          lVar11 = lVar11 + (long)iVar1 * 0x10;
        } while (lVar14 < iVar9);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar6);
  }
  lVar14 = _Var5 - _Var3;
  lVar11 = lVar14 + 1000000;
  if (-1 < lVar14) {
    lVar11 = lVar14;
  }
  dVar15 = (double)(lVar11 + ((lVar14 >> 0x3f) + (_Var4 - _Var2)) * 1000000);
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  lVar14 = timer.end.tv_usec - timer.begin.tv_usec;
  lVar11 = lVar14 + 1000000;
  if (-1 < lVar14) {
    lVar11 = lVar14;
  }
  dVar16 = (double)(((lVar14 >> 0x3f) + (timer.end.tv_sec - timer.begin.tv_sec)) * 1000000 + lVar11)
  ;
  printf("aom_getvar_16x16_dual for block=%dx%d : ref_time=%lf \t simd_time=%lf \t gain=%lf \n",
         dVar15,dVar16,dVar15 / dVar16,
         (ulong)(uint)(pGVar12->super_GetSseSum16x16DualTest).params_.width,
         (ulong)(uint)(pGVar12->super_GetSseSum16x16DualTest).params_.height);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, DISABLED_Speed) { SseSum_SpeedTestDual(); }